

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O1

void __thiscall btSoftBody::updatePose(btSoftBody *this)

{
  undefined8 uVar1;
  btVector3 *pbVar2;
  undefined1 auVar3 [16];
  btScalar bVar4;
  btScalar bVar5;
  int iVar6;
  long lVar7;
  btScalar *pbVar8;
  long lVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  btVector3 bVar22;
  btMatrix3x3 r_1;
  btMatrix3x3 s;
  btMatrix3x3 r;
  btMatrix3x3 local_d8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  btMatrix3x3 local_78;
  btMatrix3x3 local_48;
  
  if ((this->m_pose).m_bframe == true) {
    bVar22 = evaluateCom(this);
    *&(this->m_pose).m_com.m_floats = bVar22.m_floats;
    local_d8.m_el[0].m_floats[2] = 0.0;
    local_d8.m_el[0].m_floats[3] = 0.0;
    local_d8.m_el[1].m_floats[2] = 0.0;
    local_d8.m_el[1].m_floats[3] = 0.0;
    local_d8.m_el[2].m_floats[0] = 0.0;
    local_d8.m_el[2].m_floats[1] = 0.0;
    local_d8.m_el[0].m_floats[1] = 0.0;
    bVar4 = local_d8.m_el[0].m_floats[1];
    local_d8.m_el[0].m_floats[0] = 1.1920929e-07;
    local_d8.m_el[0].m_floats[1] = 0.0;
    local_d8.m_el[1].m_floats[0] = 0.0;
    bVar5 = local_d8.m_el[1].m_floats[0];
    local_d8.m_el[1].m_floats[0] = 0.0;
    local_d8.m_el[1].m_floats[1] = 2.3841858e-07;
    local_d8.m_el[2].m_floats[2] = 3.5762787e-07;
    lVar7 = (long)(this->m_nodes).m_size;
    if (0 < lVar7) {
      local_d8.m_el[2].m_floats[2] = 3.5762787e-07;
      local_d8.m_el[2].m_floats[0] = 0.0;
      local_d8.m_el[2].m_floats[1] = 0.0;
      pbVar2 = (this->m_pose).m_pos.m_data;
      local_d8.m_el[0].m_floats[2] = 0.0;
      local_d8.m_el[1].m_floats[2] = 0.0;
      pbVar8 = (((this->m_nodes).m_data)->m_x).m_floats + 2;
      lVar9 = 0;
      do {
        fVar17 = *(float *)((long)(this->m_pose).m_wgh.m_data + lVar9);
        fVar20 = (((btVector3 *)(pbVar8 + -2))->m_floats[0] - bVar22.m_floats[0]) * fVar17;
        fVar19 = (pbVar8[-1] - bVar22.m_floats[1]) * fVar17;
        fVar17 = (*pbVar8 - bVar22.m_floats[2]) * fVar17;
        local_d8.m_el[0].m_floats[2] =
             local_d8.m_el[0].m_floats[2] + pbVar2->m_floats[lVar9 + 2] * fVar20;
        local_d8.m_el[0].m_floats[0] =
             local_d8.m_el[0].m_floats[0] +
             fVar20 * (float)*(undefined8 *)(pbVar2->m_floats + lVar9);
        local_d8.m_el[0].m_floats[1] =
             local_d8.m_el[0].m_floats[1] +
             fVar20 * (float)((ulong)*(undefined8 *)(pbVar2->m_floats + lVar9) >> 0x20);
        local_d8.m_el[1].m_floats[2] =
             local_d8.m_el[1].m_floats[2] + pbVar2->m_floats[lVar9 + 2] * fVar19;
        local_d8.m_el[1].m_floats[0] =
             local_d8.m_el[1].m_floats[0] +
             fVar19 * (float)*(undefined8 *)(pbVar2->m_floats + lVar9);
        local_d8.m_el[1].m_floats[1] =
             local_d8.m_el[1].m_floats[1] +
             fVar19 * (float)((ulong)*(undefined8 *)(pbVar2->m_floats + lVar9) >> 0x20);
        local_d8.m_el[2].m_floats[2] =
             local_d8.m_el[2].m_floats[2] + pbVar2->m_floats[lVar9 + 2] * fVar17;
        local_d8.m_el[2].m_floats[0] =
             local_d8.m_el[2].m_floats[0] +
             fVar17 * (float)*(undefined8 *)(pbVar2->m_floats + lVar9);
        local_d8.m_el[2].m_floats[1] =
             local_d8.m_el[2].m_floats[1] +
             fVar17 * (float)((ulong)*(undefined8 *)(pbVar2->m_floats + lVar9) >> 0x20);
        lVar9 = lVar9 + 4;
        pbVar8 = pbVar8 + 0x1e;
        bVar4 = local_d8.m_el[0].m_floats[1];
        bVar5 = local_d8.m_el[1].m_floats[0];
      } while (lVar7 * 4 != lVar9);
    }
    local_d8.m_el[1].m_floats[0] = bVar5;
    local_d8.m_el[0].m_floats[1] = bVar4;
    local_d8.m_el[2].m_floats[3] = 0.0;
    if (PolarDecompose(btMatrix3x3_const&,btMatrix3x3&,btMatrix3x3&)::polar == '\0') {
      iVar6 = __cxa_guard_acquire(&PolarDecompose(btMatrix3x3_const&,btMatrix3x3&,btMatrix3x3&)::
                                   polar);
      if (iVar6 != 0) {
        btPolarDecomposition::btPolarDecomposition
                  ((btPolarDecomposition *)
                   &PolarDecompose(btMatrix3x3_const&,btMatrix3x3&,btMatrix3x3&)::polar,0.0001,0x10)
        ;
        __cxa_guard_release(&PolarDecompose(btMatrix3x3_const&,btMatrix3x3&,btMatrix3x3&)::polar);
      }
    }
    btPolarDecomposition::decompose
              ((btPolarDecomposition *)
               &PolarDecompose(btMatrix3x3_const&,btMatrix3x3&,btMatrix3x3&)::polar,&local_d8,
               &local_48,&local_78);
    *(ulong *)(this->m_pose).m_rot.m_el[0].m_floats =
         CONCAT44(local_48.m_el[0].m_floats[1],local_48.m_el[0].m_floats[0]);
    *(ulong *)((this->m_pose).m_rot.m_el[0].m_floats + 2) =
         CONCAT44(local_48.m_el[0].m_floats[3],local_48.m_el[0].m_floats[2]);
    *(ulong *)(this->m_pose).m_rot.m_el[1].m_floats =
         CONCAT44(local_48.m_el[1].m_floats[1],local_48.m_el[1].m_floats[0]);
    *(ulong *)((this->m_pose).m_rot.m_el[1].m_floats + 2) =
         CONCAT44(local_48.m_el[1].m_floats[3],local_48.m_el[1].m_floats[2]);
    *(ulong *)(this->m_pose).m_rot.m_el[2].m_floats =
         CONCAT44(local_48.m_el[2].m_floats[1],local_48.m_el[2].m_floats[0]);
    *(ulong *)((this->m_pose).m_rot.m_el[2].m_floats + 2) =
         CONCAT44(local_48.m_el[2].m_floats[3],local_48.m_el[2].m_floats[2]);
    fVar17 = (this->m_pose).m_aqq.m_el[0].m_floats[0];
    fVar19 = (this->m_pose).m_aqq.m_el[0].m_floats[1];
    fVar20 = (this->m_pose).m_aqq.m_el[0].m_floats[2];
    fVar14 = local_48.m_el[0].m_floats[2] * fVar20 +
             local_48.m_el[0].m_floats[0] * fVar17 + local_48.m_el[0].m_floats[1] * fVar19;
    fVar16 = local_48.m_el[1].m_floats[2] * fVar20 +
             local_48.m_el[1].m_floats[0] * fVar17 + local_48.m_el[1].m_floats[1] * fVar19;
    fVar10 = fVar20 * local_48.m_el[2].m_floats[2] +
             fVar17 * local_48.m_el[2].m_floats[0] + fVar19 * local_48.m_el[2].m_floats[1];
    fVar17 = (this->m_pose).m_aqq.m_el[1].m_floats[0];
    fVar19 = (this->m_pose).m_aqq.m_el[1].m_floats[1];
    fVar20 = (this->m_pose).m_aqq.m_el[1].m_floats[2];
    fVar15 = local_48.m_el[0].m_floats[2] * fVar20 +
             local_48.m_el[0].m_floats[0] * fVar17 + local_48.m_el[0].m_floats[1] * fVar19;
    fVar18 = local_48.m_el[1].m_floats[2] * fVar20 +
             local_48.m_el[1].m_floats[0] * fVar17 + local_48.m_el[1].m_floats[1] * fVar19;
    fVar11 = fVar20 * local_48.m_el[2].m_floats[2] +
             fVar17 * local_48.m_el[2].m_floats[0] + fVar19 * local_48.m_el[2].m_floats[1];
    fVar17 = (this->m_pose).m_aqq.m_el[2].m_floats[1];
    fVar19 = (this->m_pose).m_aqq.m_el[2].m_floats[0];
    fVar20 = (this->m_pose).m_aqq.m_el[2].m_floats[2];
    fVar12 = local_48.m_el[0].m_floats[2] * fVar20 +
             local_48.m_el[0].m_floats[0] * fVar19 + local_48.m_el[0].m_floats[1] * fVar17;
    fVar21 = local_48.m_el[1].m_floats[2] * fVar20 +
             local_48.m_el[1].m_floats[0] * fVar19 + local_48.m_el[1].m_floats[1] * fVar17;
    fVar17 = local_48.m_el[2].m_floats[2] * fVar20 +
             local_48.m_el[2].m_floats[0] * fVar19 + local_48.m_el[2].m_floats[1] * fVar17;
    fVar13 = local_d8.m_el[2].m_floats[2] * fVar10 +
             local_d8.m_el[0].m_floats[2] * fVar14 + fVar16 * local_d8.m_el[1].m_floats[2];
    fVar19 = fVar10 * local_d8.m_el[2].m_floats[0] +
             fVar14 * local_d8.m_el[0].m_floats[0] + fVar16 * local_d8.m_el[1].m_floats[0];
    fVar20 = fVar10 * local_d8.m_el[2].m_floats[1] +
             fVar14 * local_d8.m_el[0].m_floats[1] + fVar16 * local_d8.m_el[1].m_floats[1];
    fVar10 = fVar11 * local_d8.m_el[2].m_floats[0] +
             fVar15 * local_d8.m_el[0].m_floats[0] + fVar18 * local_d8.m_el[1].m_floats[0];
    *(ulong *)(this->m_pose).m_scl.m_el[0].m_floats = CONCAT44(fVar20,fVar19);
    (this->m_pose).m_scl.m_el[0].m_floats[2] = fVar13;
    (this->m_pose).m_scl.m_el[0].m_floats[3] = 0.0;
    *(ulong *)(this->m_pose).m_scl.m_el[1].m_floats =
         CONCAT44(fVar11 * local_d8.m_el[2].m_floats[1] +
                  fVar15 * local_d8.m_el[0].m_floats[1] + fVar18 * local_d8.m_el[1].m_floats[1],
                  fVar10);
    (this->m_pose).m_scl.m_el[1].m_floats[2] =
         local_d8.m_el[2].m_floats[2] * fVar11 +
         local_d8.m_el[0].m_floats[2] * fVar15 + fVar18 * local_d8.m_el[1].m_floats[2];
    fVar11 = fVar17 * local_d8.m_el[2].m_floats[0] +
             fVar12 * local_d8.m_el[0].m_floats[0] + fVar21 * local_d8.m_el[1].m_floats[0];
    (this->m_pose).m_scl.m_el[1].m_floats[3] = 0.0;
    *(ulong *)(this->m_pose).m_scl.m_el[2].m_floats =
         CONCAT44(fVar17 * local_d8.m_el[2].m_floats[1] +
                  fVar12 * local_d8.m_el[0].m_floats[1] + fVar21 * local_d8.m_el[1].m_floats[1],
                  fVar11);
    (this->m_pose).m_scl.m_el[2].m_floats[2] =
         local_d8.m_el[2].m_floats[2] * fVar17 +
         local_d8.m_el[0].m_floats[2] * fVar12 + local_d8.m_el[1].m_floats[2] * fVar21;
    (this->m_pose).m_scl.m_el[2].m_floats[3] = 0.0;
    fVar17 = (this->m_cfg).maxvolume;
    if (1.0 < fVar17) {
      fVar12 = (this->m_pose).m_scl.m_el[2].m_floats[2];
      fVar14 = (this->m_pose).m_scl.m_el[1].m_floats[1];
      fVar15 = (this->m_pose).m_scl.m_el[1].m_floats[2];
      fVar16 = (this->m_pose).m_scl.m_el[2].m_floats[1];
      fVar19 = 1.0 / (fVar13 * (fVar16 * fVar10 - fVar11 * fVar14) +
                     (fVar14 * fVar12 - fVar16 * fVar15) * fVar19 +
                     fVar20 * (fVar15 * fVar11 - fVar12 * fVar10));
      if (fVar19 <= fVar17) {
        fVar17 = fVar19;
      }
      fVar17 = (float)(-(uint)(fVar19 < 1.0) & 0x3f800000 | ~-(uint)(fVar19 < 1.0) & (uint)fVar17);
      lVar7 = 0;
      do {
        uVar1 = *(undefined8 *)((long)(this->m_pose).m_scl.m_el[0].m_floats + lVar7);
        auVar3._4_4_ = (float)((ulong)uVar1 >> 0x20) * fVar17;
        auVar3._0_4_ = (float)uVar1 * fVar17;
        auVar3._8_4_ = *(float *)((long)(this->m_pose).m_scl.m_el[0].m_floats + lVar7 + 8) * fVar17;
        auVar3._12_4_ = 0;
        *(undefined1 (*) [16])((long)&local_a8 + lVar7) = auVar3;
        lVar7 = lVar7 + 0x10;
      } while (lVar7 != 0x30);
      *(undefined8 *)(this->m_pose).m_scl.m_el[0].m_floats = local_a8;
      *(undefined8 *)((this->m_pose).m_scl.m_el[0].m_floats + 2) = uStack_a0;
      *(undefined8 *)(this->m_pose).m_scl.m_el[1].m_floats = local_98;
      *(undefined8 *)((this->m_pose).m_scl.m_el[1].m_floats + 2) = uStack_90;
      *(undefined8 *)(this->m_pose).m_scl.m_el[2].m_floats = local_88;
      *(undefined8 *)((this->m_pose).m_scl.m_el[2].m_floats + 2) = uStack_80;
    }
  }
  return;
}

Assistant:

void					btSoftBody::updatePose()
{
	if(m_pose.m_bframe)
	{
		btSoftBody::Pose&	pose=m_pose;
		const btVector3		com=evaluateCom();
		/* Com			*/ 
		pose.m_com	=	com;
		/* Rotation		*/ 
		btMatrix3x3		Apq;
		const btScalar	eps=SIMD_EPSILON;
		Apq[0]=Apq[1]=Apq[2]=btVector3(0,0,0);
		Apq[0].setX(eps);Apq[1].setY(eps*2);Apq[2].setZ(eps*3);
		for(int i=0,ni=m_nodes.size();i<ni;++i)
		{
			const btVector3		a=pose.m_wgh[i]*(m_nodes[i].m_x-com);
			const btVector3&	b=pose.m_pos[i];
			Apq[0]+=a.x()*b;
			Apq[1]+=a.y()*b;
			Apq[2]+=a.z()*b;
		}
		btMatrix3x3		r,s;
		PolarDecompose(Apq,r,s);
		pose.m_rot=r;
		pose.m_scl=pose.m_aqq*r.transpose()*Apq;
		if(m_cfg.maxvolume>1)
		{
			const btScalar	idet=Clamp<btScalar>(	1/pose.m_scl.determinant(),
				1,m_cfg.maxvolume);
			pose.m_scl=Mul(pose.m_scl,idet);
		}

	}
}